

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int cmcmd::SymlinkExecutable
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  reference pvVar2;
  undefined1 local_58 [8];
  string name;
  string realName;
  int result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  realName.field_2._12_4_ = 0;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  std::__cxx11::string::string((string *)local_58,(string *)pvVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&name.field_2 + 8));
  if (bVar1) {
    bVar1 = SymlinkInternal((string *)((long)&name.field_2 + 8),(string *)local_58);
    if (!bVar1) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_executable");
    }
    realName.field_2._13_3_ = 0;
    realName.field_2._M_local_buf[0xc] = !bVar1;
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return realName.field_2._12_4_;
}

Assistant:

int cmcmd::SymlinkExecutable(std::vector<std::string>& args)
{
  int result = 0;
  std::string realName = args[2];
  std::string name = args[3];
  if(name != realName)
    {
    if(!cmcmd::SymlinkInternal(realName, name))
      {
      cmSystemTools::ReportLastSystemError("cmake_symlink_executable");
      result = 1;
      }
    }
  return result;
}